

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O0

void __thiscall
duckdb::OrderLocalSinkState::OrderLocalSinkState
          (OrderLocalSinkState *this,ClientContext *context,PhysicalOrder *op)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator allocator_00;
  Allocator *capacity_p;
  Expression *in_RDI;
  LocalSortState *unaff_retaddr;
  Allocator *allocator;
  BoundOrderByNode *order;
  const_iterator __end2;
  const_iterator __begin2;
  vector<duckdb::BoundOrderByNode,_true> *__range2;
  vector<duckdb::LogicalType,_true> key_types;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  *in_stack_ffffffffffffff48;
  DataChunk *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  type in_stack_ffffffffffffff60;
  ClientContext *in_stack_ffffffffffffff78;
  ExpressionExecutor *this_01;
  reference in_stack_ffffffffffffffa0;
  
  LocalSinkState::LocalSinkState((LocalSinkState *)0x18562d1);
  (in_RDI->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)&PTR__OrderLocalSinkState_0352e628;
  this_01 = (ExpressionExecutor *)&(in_RDI->super_BaseExpression).query_location;
  LocalSortState::LocalSortState(unaff_retaddr);
  ExpressionExecutor::ExpressionExecutor
            ((ExpressionExecutor *)&in_RDI[2].verification_stats,in_stack_ffffffffffffff78);
  DataChunk::DataChunk(in_stack_ffffffffffffff50);
  DataChunk::DataChunk(in_stack_ffffffffffffff50);
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x185634e);
  this_00 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
            begin(in_stack_ffffffffffffff48);
  allocator_00 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         __gnu_cxx::
         __normal_iterator<const_duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
         ::operator*((__normal_iterator<const_duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                      *)&stack0xffffffffffffffb0);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_ffffffffffffff50);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 = (value_type *)&in_RDI[2].verification_stats;
    in_stack_ffffffffffffff60 =
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_ffffffffffffff50);
    ExpressionExecutor::AddExpression(this_01,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
    ::operator++((__normal_iterator<const_duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                  *)&stack0xffffffffffffffb0);
  }
  capacity_p = Allocator::Get((ClientContext *)0x18564b2);
  DataChunk::Initialize
            ((DataChunk *)this_00._M_current,(Allocator *)allocator_00._M_current,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa0,(idx_t)capacity_p);
  DataChunk::Initialize
            ((DataChunk *)this_00._M_current,(Allocator *)allocator_00._M_current,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa0,(idx_t)capacity_p);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1856518);
  return;
}

Assistant:

OrderLocalSinkState(ClientContext &context, const PhysicalOrder &op) : key_executor(context) {
		// Initialize order clause expression executor and DataChunk
		vector<LogicalType> key_types;
		for (auto &order : op.orders) {
			key_types.push_back(order.expression->return_type);
			key_executor.AddExpression(*order.expression);
		}
		auto &allocator = Allocator::Get(context);
		keys.Initialize(allocator, key_types);
		payload.Initialize(allocator, op.types);
	}